

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
              *this,int i)

{
  value_type local_70;
  value_type local_50;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_30;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_50,&this->left_->fadexpr_,i);
  FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>
  ::fastAccessDx(&local_70,&this->right_->fadexpr_,i);
  local_30.fadexpr_.left_ = &local_50;
  local_30.fadexpr_.right_ = &local_70;
  Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}